

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_cpio_empty.c
# Opt level: O0

void test_write_format_cpio_empty(void)

{
  int iVar1;
  archive *_a;
  size_t local_820;
  size_t used;
  char buff [2048];
  archive *a;
  
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_empty.c"
                   ,L'5',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_cpio_odc(_a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_empty.c"
                   ,L'6',(uint)(iVar1 == 0),"0 == archive_write_set_format_cpio_odc(a)",_a);
  iVar1 = archive_write_add_filter_none(_a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_empty.c"
                   ,L'7',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",_a);
  iVar1 = archive_write_set_bytes_per_block(_a,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_empty.c"
                   ,L':',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 1)",_a);
  iVar1 = archive_write_set_bytes_in_last_block(_a,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_empty.c"
                   ,L';',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 1)",_a);
  iVar1 = archive_write_open_memory(_a,&used,0x800,&local_820);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_empty.c"
                   ,L'<',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",_a);
  iVar1 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_empty.c"
                      ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",_a);
  iVar1 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_empty.c"
                      ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  failure("Empty cpio archive should be exactly 87 bytes, was %zu.",local_820);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_empty.c"
                   ,L'C',(uint)(local_820 == 0x57),"used == 87",(void *)0x0);
  failure("Empty cpio archive is incorrectly formatted.");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_empty.c"
                      ,L'E',&used,"buff",ref,"ref",0x57,"87",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_cpio_empty)
{
	struct archive *a;
	char buff[2048];
	size_t used;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_cpio_odc(a));
	assertA(0 == archive_write_add_filter_none(a));
	/* 1-byte block size ensures we see only the required bytes. */
	/* We're not testing the padding here. */
	assertA(0 == archive_write_set_bytes_per_block(a, 1));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 1));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	failure("Empty cpio archive should be exactly 87 bytes, was %zu.", used);
	assert(used == 87);
	failure("Empty cpio archive is incorrectly formatted.");
	assertEqualMem(buff, ref, 87);
}